

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biffopen(bifcxdef *ctx,int argc)

{
  void *p_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  runcxdef *ctx_00;
  long in_RDI;
  char newname [4096];
  appctxdef *appctx;
  int in_same_dir;
  char main_mode;
  int rw_mode;
  int bin_mode;
  osfildef *fp;
  int fnum;
  int modelen;
  uchar *mode;
  uchar *p;
  char fname [4096];
  undefined4 in_stack_ffffffffffffdf78;
  int in_stack_ffffffffffffdf7c;
  undefined4 in_stack_ffffffffffffdf80;
  int in_stack_ffffffffffffdf84;
  undefined4 in_stack_ffffffffffffdf88;
  uint in_stack_ffffffffffffdf8c;
  char *in_stack_ffffffffffffdf90;
  uchar *in_stack_ffffffffffffdf98;
  char *in_stack_ffffffffffffdfa8;
  bifcxdef *in_stack_ffffffffffffdfb0;
  char local_1041;
  FILE *local_1038;
  int local_1030;
  int local_102c;
  byte *local_1028;
  char local_1018 [4016];
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  
  bVar1 = true;
  bVar2 = false;
  lVar5 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar5 + -0x10;
  if (*(char *)(lVar5 + -0x10) != '\x03') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
            in_stack_ffffffffffffdf7c);
  }
  bifcstr(in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfa8,
          *(size_t *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8),in_stack_ffffffffffffdf98);
  iVar3 = os_is_file_absolute((char *)CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78))
  ;
  if (iVar3 == 0) {
    os_build_full_path(in_stack_ffffffffffffdf90,
                       CONCAT44(in_stack_ffffffffffffdf8c,in_stack_ffffffffffffdf88),
                       (char *)CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
                       (char *)CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78));
    strcpy(local_1018,&stack0xffffffffffffdfa8);
  }
  lVar5 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar5 + -0x10;
  if (*(char *)(lVar5 + -0x10) != '\x03') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
            in_stack_ffffffffffffdf7c);
  }
  p_00 = *(void **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  iVar3 = osrp2(p_00);
  if (iVar3 + -2 < 1) goto LAB_0026d207;
  local_1030 = 0;
  while ((local_1030 < 10 && (*(long *)(in_RDI + 0x30 + (long)local_1030 * 0x10) != 0))) {
    local_1030 = local_1030 + 1;
  }
  if (local_1030 == 10) {
    runpnil((runcxdef *)CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80));
    return;
  }
  ctx_00 = (runcxdef *)(ulong)(*(byte *)((long)p_00 + 2) - 0x52);
  switch(ctx_00) {
  case (runcxdef *)0x0:
  case (runcxdef *)0x20:
    local_1041 = 'r';
    break;
  default:
    goto LAB_0026d207;
  case (runcxdef *)0x5:
  case (runcxdef *)0x25:
    local_1041 = 'w';
  }
  local_1028 = (byte *)((long)p_00 + 3);
  local_102c = iVar3 + -3;
  if ((0 < local_102c) && (*local_1028 == 0x2b)) {
    bVar2 = true;
    local_1028 = (byte *)((long)p_00 + 4);
    local_102c = iVar3 + -4;
  }
  if (0 < local_102c) {
    in_stack_ffffffffffffdf8c = (uint)*local_1028;
    if (in_stack_ffffffffffffdf8c == 0x42) {
LAB_0026ce8d:
      bVar1 = true;
    }
    else {
      if (in_stack_ffffffffffffdf8c != 0x54) {
        if (in_stack_ffffffffffffdf8c == 0x62) goto LAB_0026ce8d;
        if (in_stack_ffffffffffffdf8c != 0x74) goto LAB_0026d207;
      }
      bVar1 = false;
    }
    local_102c = local_102c + -1;
  }
  if (local_102c < 1) {
    lVar5 = *(long *)(in_RDI + 0xe0);
    if ((lVar5 != 0) && (*(long *)(lVar5 + 0xb0) != 0)) {
      (**(code **)(lVar5 + 0xb0))(*(undefined8 *)(lVar5 + 0xb8),in_RDI + 0xd0,in_RDI + 0xd4);
    }
    iVar3 = os_is_file_in_dir(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                              in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    iVar4 = (int)local_1041;
    if (iVar4 == 0x72) {
      if ((3 < *(int *)(in_RDI + 0xd0)) || ((iVar3 == 0 && (1 < *(int *)(in_RDI + 0xd0))))) {
        runpnil((runcxdef *)CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80));
        return;
      }
    }
    else {
      if (iVar4 != 0x77) goto LAB_0026d207;
      if ((2 < *(int *)(in_RDI + 0xd4)) || ((iVar3 == 0 && (0 < *(int *)(in_RDI + 0xd4))))) {
        runpnil((runcxdef *)CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80));
        return;
      }
    }
    in_stack_ffffffffffffdf84 = (int)local_1041;
    if (in_stack_ffffffffffffdf84 == 0x72) {
      if (bVar1) {
        if (bVar2) {
          local_1038 = (FILE *)osfoprwb((char *)CONCAT44(0x72,in_stack_ffffffffffffdf80),
                                        in_stack_ffffffffffffdf7c);
        }
        else {
          local_1038 = fopen(local_1018,"rb");
        }
      }
      else {
        if (bVar2) goto LAB_0026d207;
        local_1038 = fopen(local_1018,"r");
      }
    }
    else {
      if (in_stack_ffffffffffffdf84 != 0x77) goto LAB_0026d207;
      if (bVar1) {
        if (bVar2) {
          local_1038 = fopen(local_1018,"w+b");
        }
        else {
          local_1038 = fopen(local_1018,"wb");
        }
      }
      else {
        if (bVar2) goto LAB_0026d207;
        local_1038 = fopen(local_1018,"w");
      }
    }
    if (local_1038 == (FILE *)0x0) {
      runpnil((runcxdef *)CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80));
    }
    else {
      *(undefined4 *)(in_RDI + (long)local_1030 * 0x10 + 0x38) = 0;
      if (bVar1) {
        lVar5 = in_RDI + 0x30 + (long)local_1030 * 0x10;
        *(uint *)(lVar5 + 8) = *(uint *)(lVar5 + 8) | 1;
      }
      *(FILE **)(in_RDI + 0x30 + (long)local_1030 * 0x10) = local_1038;
      runpnum(ctx_00,CONCAT44(in_stack_ffffffffffffdf8c,iVar4));
    }
    return;
  }
LAB_0026d207:
  *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "fopen";
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
  runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80),
          in_stack_ffffffffffffdf7c);
}

Assistant:

void biffopen(bifcxdef *ctx, int argc)
{
    char      fname[OSFNMAX];
    uchar    *p;
    uchar    *mode;
    int       modelen;
    int       fnum;
    osfildef *fp;
    int       bin_mode = TRUE;   /* flag: mode is binary (rather than text) */
    int       rw_mode = FALSE;     /* flag: both read and write are allowed */
    char      main_mode;                     /* 'r' for read, 'w' for write */
    int       in_same_dir;            /* flag: file is in current directory */
    appctxdef *appctx;
    
    bifcntargs(ctx, 2, argc);

    /* get the filename */
    p = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, fname, (size_t)sizeof(fname), p);

    /* 
     *   If it's a relative path, combine it with the game file path to form
     *   the absolute path.  This ensures that relative paths are always
     *   relative to the original working directory if the OS-level working
     *   directory has changed. 
     */
    if (!os_is_file_absolute(fname))
    {
        /* combine the game file path with the relative filename */
        char newname[OSFNMAX];
        os_build_full_path(newname, sizeof(newname),
                           ctx->bifcxrun->runcxgamepath, fname);

        /* replace the original filename with the full path */
        strcpy(fname, newname);
    }

    /* get the mode string */
    mode = runpopstr(ctx->bifcxrun);
    modelen = osrp2(mode) - 2;
    mode += 2;
    if (modelen < 1)
        goto bad_mode;

    /* allocate a filenum for the file */
    for (fnum = 0 ; fnum < BIFFILMAX ; ++fnum)
    {
        if (ctx->bifcxfile[fnum].fp == 0)
            break;
    }
    if (fnum == BIFFILMAX)
    {
        /* return nil to indicate failure */
        runpnil(ctx->bifcxrun);
        return;
    }

    /* parse the main mode */
    switch(*mode)
    {
    case 'w':
    case 'W':
        main_mode = 'w';
        break;

    case 'r':
    case 'R':
        main_mode = 'r';
        break;

    default:
        goto bad_mode;
    }

    /* skip the main mode, and check for a '+' flag */
    ++mode;
    --modelen;
    if (modelen > 0 && *mode == '+')
    {
        /* note the read/write mode */
        rw_mode = TRUE;

        /* skip the speciifer */
        ++mode;
        --modelen;
    }

    /* check for a binary/text specifier */
    if (modelen > 0)
    {
        switch(*mode)
        {
        case 'b':
        case 'B':
            bin_mode = TRUE;
            break;

        case 't':
        case 'T':
            bin_mode = FALSE;
            break;

        default:
            goto bad_mode;
        }

        /* skip the binary/text specifier */
        ++mode;
        --modelen;
    }

    /* it's an error if there's anything left unparsed */
    if (modelen > 0)
        goto bad_mode;

    /*
     *   If we have a host application context, and it provides a file
     *   safety level callback function, ask the host system for its
     *   current file safety level, which overrides our current setting.  
     */
    appctx = ctx->bifcxappctx;
    if (appctx != 0 && appctx->get_io_safety_level != 0)
    {
        /* 
         *   ask the host system for the current level, and override any
         *   setting we previously had 
         */
        (*appctx->get_io_safety_level)(
            appctx->io_safety_level_ctx,
            &ctx->bifcxsafetyr, &ctx->bifcxsafetyw);
    }

    /* 
     *   Check to see if the file is in the current working directory - if
     *   not, we may have to disallow the operation based on safety level
     *   settings.
     */
    in_same_dir = os_is_file_in_dir(
        fname, ctx->bifcxrun->runcxgamepath, TRUE, FALSE);

    /* check file safety settings */
    switch(main_mode)
    {
    case 'w':
        /* 
         *   writing - we must be at a safety level no higher than 2
         *   (read/write current directory) to write at all, and we must be
         *   level 0 to write a file that's not in the current directory 
         */
        if (ctx->bifcxsafetyw > 2
            || (!in_same_dir && ctx->bifcxsafetyw > 0))
        {
            /* this operation is not allowed - return failure */
            runpnil(ctx->bifcxrun);
            return;
        }
        break;

    case 'r':
        /*
         *   reading - we must be at a safety level no higher than 3 (read
         *   current directory) to read at all, and we must be at safety
         *   level 1 (read any directory) or lower to read a file that's not
         *   in the current directory 
         */
        if (ctx->bifcxsafetyr > 3
            || (!in_same_dir && ctx->bifcxsafetyr > 1))
        {
            /* this operation is not allowed - return failure */
            runpnil(ctx->bifcxrun);
            return;
        }
        break;

    default:
        /* 
         *   fail the operation, as a code maintenance measure to make
         *   sure that we add appropriate cases to this switch (even if
         *   merely to allow the operation unconditionally) in the event
         *   that more modes are added in the future 
         */
        goto bad_mode;
    }

    /* try opening the file */
    switch(main_mode)
    {
    case 'w':
        /* check for binary vs text mode */
        if (bin_mode)
        {
            /* 
             *   binary mode -- allow read/write or just writing, but in
             *   either case truncate the file if it already exists, and
             *   create a new file if it doesn't exist 
             */
            if (rw_mode)
                fp = osfoprwtb(fname, OSFTDATA);
            else
                fp = osfopwb(fname, OSFTDATA);
        }
        else
        {
            /* text mode - don't allow read/write on a text file */
            if (rw_mode)
                goto bad_mode;

            /* open the file */
            fp = osfopwt(fname, OSFTTEXT);
        }
        break;

    case 'r':
        /* check for binary vs text mode */
        if (bin_mode)
        {
            /*
             *   Binary mode -- allow read/write or just reading; leave
             *   any existing file intact.
             */
            if (rw_mode)
            {
                /* open for reading and writing, keeping existing data */
                fp = osfoprwb(fname, OSFTDATA);
            }
            else
            {
                /* open for read-only */
                fp = osfoprb(fname, OSFTDATA);
            }
        }
        else
        {
            /* text mode -- only allow reading */
            if (rw_mode)
                goto bad_mode;

            /* open the file */
            fp = osfoprt(fname, OSFTTEXT);
        }
        break;

    default:
        goto bad_mode;
    }

    /* if we couldn't open it, return nil */
    if (fp == 0)
    {
        runpnil(ctx->bifcxrun);
        return;
    }

    /* store the flags */
    ctx->bifcxfile[fnum].flags = 0;
    if (bin_mode)
        ctx->bifcxfile[fnum].flags |= BIFFIL_F_BINARY;

    /* remember the file handle */
    ctx->bifcxfile[fnum].fp = fp;

    /* return the file number (i.e., the slot number) */
    runpnum(ctx->bifcxrun, (long)fnum);
    return;


    /* come here on a mode error */
bad_mode:
    runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "fopen");
}